

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  float fVar1;
  float fVar2;
  float x0;
  float y0;
  undefined2 uVar3;
  undefined2 uVar5;
  undefined4 uVar6;
  ImVec2 IVar4;
  char cVar7;
  ushort uVar8;
  int iVar9;
  int iVar10;
  ImFontAtlasCustomRect *pIVar11;
  ImFont *pIVar12;
  ImFont **ppIVar13;
  undefined1 auVar14 [16];
  uint uVar15;
  int y;
  int iVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  iVar9 = atlas->CustomRectIds[0];
  pIVar11 = (atlas->CustomRects).Data;
  iVar10 = atlas->TexWidth;
  if ((atlas->Flags & 2) == 0) {
    iVar16 = 0;
    lVar21 = 0;
    do {
      lVar23 = 0;
      do {
        cVar7 = "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                [(int)lVar21 + lVar23];
        lVar24 = (long)(int)((uint)pIVar11[iVar9].X + (int)lVar23 +
                            ((uint)pIVar11[iVar9].Y + iVar16) * iVar10);
        atlas->TexPixelsAlpha8[lVar24] = -(cVar7 == '.');
        atlas->TexPixelsAlpha8[lVar24 + 0x6d] = -(cVar7 == 'X');
        lVar23 = lVar23 + 1;
      } while ((int)lVar23 != 0x6c);
      iVar16 = iVar16 + 1;
      lVar21 = (int)lVar21 + lVar23;
    } while (iVar16 != 0x1b);
  }
  else {
    lVar23 = (ulong)pIVar11[iVar9].Y * (long)iVar10 + (ulong)pIVar11[iVar9].X;
    lVar21 = (long)(iVar10 + (int)lVar23);
    atlas->TexPixelsAlpha8[lVar21 + 1] = 0xff;
    atlas->TexPixelsAlpha8[lVar21] = 0xff;
    atlas->TexPixelsAlpha8[lVar23 + 1] = 0xff;
    atlas->TexPixelsAlpha8[lVar23] = 0xff;
  }
  pIVar11 = pIVar11 + iVar9;
  uVar3 = pIVar11->X;
  uVar5 = pIVar11->Y;
  uVar6 = pIVar11->GlyphAdvanceX;
  auVar25._4_4_ = uVar6;
  auVar25._2_2_ = uVar5;
  auVar25._0_2_ = uVar3;
  auVar25._8_8_ = 0;
  auVar25 = vpmovzxwd_avx(auVar25);
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar14._8_4_ = 0x3f000000;
  auVar14._0_8_ = 0x3f0000003f000000;
  auVar14._12_4_ = 0x3f000000;
  auVar25 = vaddps_avx512vl(auVar25,auVar14);
  auVar26._0_4_ = (atlas->TexUvScale).x * auVar25._0_4_;
  auVar26._4_4_ = (atlas->TexUvScale).y * auVar25._4_4_;
  auVar26._8_4_ = auVar25._8_4_ * 0.0;
  auVar26._12_4_ = auVar25._12_4_ * 0.0;
  IVar4 = (ImVec2)vmovlps_avx(auVar26);
  atlas->TexUvWhitePixel = IVar4;
  if (0 < (atlas->CustomRects).Size) {
    lVar21 = 0x18;
    lVar23 = 0;
    do {
      pIVar11 = (atlas->CustomRects).Data;
      pIVar12 = *(ImFont **)((long)&pIVar11->ID + lVar21);
      uVar15 = *(uint *)((long)pIVar11 + lVar21 + -0x18);
      if (uVar15 < 0x110000 && pIVar12 != (ImFont *)0x0) {
        uVar17 = (uint)*(ushort *)((long)pIVar11 + lVar21 + -0x10);
        fVar1 = (atlas->TexUvScale).x;
        fVar2 = (atlas->TexUvScale).y;
        uVar20 = (uint)*(ushort *)((long)pIVar11 + lVar21 + -0xe);
        uVar22 = (uint)*(ushort *)((long)pIVar11 + lVar21 + -0x14);
        uVar18 = (uint)*(ushort *)((long)pIVar11 + lVar21 + -0x12);
        x0 = *(float *)((long)pIVar11 + lVar21 + -8);
        y0 = *(float *)((long)pIVar11 + lVar21 + -4);
        ImFont::AddGlyph(pIVar12,(ImWchar)uVar15,x0,y0,x0 + (float)uVar22,y0 + (float)uVar18,
                         fVar1 * (float)uVar17,fVar2 * (float)uVar20,
                         fVar1 * (float)(uVar17 + uVar22),fVar2 * (float)(uVar20 + uVar18),
                         *(float *)((long)pIVar11 + lVar21 + -0xc));
      }
      lVar23 = lVar23 + 1;
      lVar21 = lVar21 + 0x20;
    } while (lVar23 < (atlas->CustomRects).Size);
  }
  uVar15 = (atlas->Fonts).Size;
  if (0 < (int)uVar15) {
    lVar21 = 0;
    do {
      pIVar12 = (atlas->Fonts).Data[lVar21];
      if (pIVar12->DirtyLookupTables == true) {
        ImFont::BuildLookupTable(pIVar12);
      }
      lVar21 = lVar21 + 1;
      uVar15 = (atlas->Fonts).Size;
    } while (lVar21 < (int)uVar15);
  }
  if (0 < (int)uVar15) {
    ppIVar13 = (atlas->Fonts).Data;
    uVar19 = 0;
    do {
      pIVar12 = ppIVar13[uVar19];
      if (pIVar12->EllipsisChar == 0xffff) {
        lVar21 = 0;
        do {
          uVar8 = *(ushort *)((long)&DAT_004386a0 + lVar21);
          if ((((ulong)uVar8 < (ulong)(long)(pIVar12->IndexLookup).Size) &&
              ((pIVar12->IndexLookup).Data[uVar8] != 0xffff)) &&
             ((pIVar12->Glyphs).Data != (ImFontGlyph *)0x0)) {
            pIVar12->EllipsisChar = uVar8;
            break;
          }
          lVar21 = lVar21 + 2;
        } while (lVar21 == 2);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar15);
  }
  return;
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data block
    ImFontAtlasBuildRenderDefaultTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect& r = atlas->CustomRects[i];
        if (r.Font == NULL || r.ID >= 0x110000)
            continue;

        IM_ASSERT(r.Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(&r, &uv0, &uv1);
        r.Font->AddGlyph((ImWchar)r.ID, r.GlyphOffset.x, r.GlyphOffset.y, r.GlyphOffset.x + r.Width, r.GlyphOffset.y + r.Height, uv0.x, uv0.y, uv1.x, uv1.y, r.GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Also note that 0x2026 is currently seldomly included in our font ranges. Because of this we are more likely to use three individual dots.
    for (int i = 0; i < atlas->Fonts.size(); i++)
    {
        ImFont* font = atlas->Fonts[i];
        if (font->EllipsisChar != (ImWchar)-1)
            continue;
        const ImWchar ellipsis_variants[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
        for (int j = 0; j < IM_ARRAYSIZE(ellipsis_variants); j++)
            if (font->FindGlyphNoFallback(ellipsis_variants[j]) != NULL) // Verify glyph exists
            {
                font->EllipsisChar = ellipsis_variants[j];
                break;
            }
    }
}